

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O0

tuple<double,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutFun(Kriging *this,vec *_theta,bool _grad,bool _bench)

{
  bool bVar1;
  ostream *poVar2;
  byte in_CL;
  tuple<double,_arma::Col<double>_> *in_RDI;
  byte in_R8B;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *kv_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *kv;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range2;
  size_t num;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  bench;
  vec grad;
  double loo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_00001dd0;
  KModel *in_stack_00001dd8;
  mat *in_stack_00001de0;
  vec *in_stack_00001de8;
  vec *in_stack_00001df0;
  Kriging *in_stack_00001df8;
  Col<double> *in_stack_fffffffffffffc88;
  Col<double> *in_stack_fffffffffffffc90;
  Col<double> *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  uword in_n_elem;
  Col<double> *in_stack_fffffffffffffca8;
  ostream *in_stack_fffffffffffffcb8;
  char paddingChar;
  string *in_stack_fffffffffffffcc8;
  string local_258 [32];
  string local_238 [32];
  reference local_218;
  _Self local_210;
  _Self local_208;
  undefined1 *local_200;
  unsigned_long local_1f8;
  reference local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  undefined1 *local_1d8;
  unsigned_long local_1d0 [25];
  undefined1 local_108 [224];
  Col<double> *local_28;
  byte local_1a;
  byte local_19;
  
  in_n_elem = (uword)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_28 = (Col<double> *)0xbff0000000000000;
  arma::Col<double>::Col(in_stack_fffffffffffffc90);
  if ((local_1a & 1) == 0) {
    if ((local_19 & 1) == 0) {
      in_stack_fffffffffffffc90 =
           (Col<double> *)
           _leaveOneOut(in_stack_00001df8,in_stack_00001df0,in_stack_00001de8,in_stack_00001de0,
                        in_stack_00001dd8,in_stack_00001dd0);
      local_28 = in_stack_fffffffffffffc90;
    }
    else {
      arma::Col<double>::Col(in_stack_fffffffffffffca8,in_n_elem);
      arma::Col<double>::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      arma::Col<double>::~Col((Col<double> *)0x193e8d);
      in_stack_fffffffffffffc98 =
           (Col<double> *)
           _leaveOneOut(in_stack_00001df8,in_stack_00001df0,in_stack_00001de8,in_stack_00001de0,
                        in_stack_00001dd8,in_stack_00001dd0);
      local_28 = in_stack_fffffffffffffc98;
    }
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           *)0x193aa8);
    if ((local_19 & 1) == 0) {
      local_28 = (Col<double> *)
                 _leaveOneOut(in_stack_00001df8,in_stack_00001df0,in_stack_00001de8,
                              in_stack_00001de0,in_stack_00001dd8,in_stack_00001dd0);
    }
    else {
      arma::Col<double>::Col(in_stack_fffffffffffffca8,in_n_elem);
      arma::Col<double>::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      arma::Col<double>::~Col((Col<double> *)0x193af4);
      local_28 = (Col<double> *)
                 _leaveOneOut(in_stack_00001df8,in_stack_00001df0,in_stack_00001de8,
                              in_stack_00001de0,in_stack_00001dd8,in_stack_00001dd0);
    }
    local_1d0[0] = 0;
    local_1d8 = local_108;
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)in_stack_fffffffffffffc88);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_fffffffffffffc88);
    while (bVar1 = std::operator!=(&local_1e0,&local_1e8), bVar1) {
      local_1f0 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                               *)0x193c20);
      local_1f8 = std::__cxx11::string::size();
      in_stack_fffffffffffffcc8 = (string *)std::max<unsigned_long>(&local_1f8,local_1d0);
      local_1d0[0] = *(unsigned_long *)in_stack_fffffffffffffcc8;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    *)in_stack_fffffffffffffc90);
    }
    local_200 = local_108;
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)in_stack_fffffffffffffc88);
    local_210._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_fffffffffffffc88);
    while( true ) {
      paddingChar = (char)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
      bVar1 = std::operator!=(&local_208,&local_210);
      if (!bVar1) break;
      local_218 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                               *)0x193cdd);
      poVar2 = std::operator<<((ostream *)&std::cout,"| ");
      std::__cxx11::string::string(local_258,(string *)local_218);
      Bench::pad(in_stack_fffffffffffffcc8,(size_t)poVar2,paddingChar);
      in_stack_fffffffffffffcb8 = std::operator<<(poVar2,local_238);
      poVar2 = std::operator<<(in_stack_fffffffffffffcb8," | ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_218->second);
      poVar2 = std::operator<<(poVar2," |");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    *)in_stack_fffffffffffffc90);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            *)0x193e33);
  }
  std::make_tuple<double&,arma::Col<double>>
            ((double *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  arma::Col<double>::~Col((Col<double> *)0x193f66);
  return in_RDI;
}

Assistant:

LIBKRIGING_EXPORT std::tuple<double, arma::vec> Kriging::leaveOneOutFun(const arma::vec& _theta,
                                                                        const bool _grad,
                                                                        const bool _bench) {
  double loo = -1;
  arma::vec grad;

  if (_bench) {
    std::map<std::string, double> bench;
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, &bench);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, &bench);

    size_t num = 0;
    for (auto& kv : bench)
      num = std::max(kv.first.size(), num);
    for (auto& kv : bench)
      arma::cout << "| " << Bench::pad(kv.first, num, ' ') << " | " << kv.second << " |" << arma::endl;

  } else {
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, nullptr);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, nullptr);
  }

  return std::make_tuple(loo, std::move(grad));
}